

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QByteArray * __thiscall Moc::parsePropertyAccessor(Moc *this)

{
  long lVar1;
  Token TVar2;
  Parser *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  Token t;
  int nesting;
  QByteArray *accessor;
  QByteArray *this_00;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x13ad98);
  while ((TVar2 = Parser::peek(in_RSI), local_34 != 0 || ((TVar2 != PP_RPAREN && (TVar2 != COMMA))))
        ) {
    TVar2 = Parser::next(in_RSI);
    if (TVar2 == LPAREN) {
      local_34 = local_34 + 1;
    }
    if (TVar2 == PP_RPAREN) {
      local_34 = local_34 + -1;
    }
    Parser::lexem(in_RSI);
    QByteArray::operator+=(this_00,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x13ae18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QByteArray Moc::parsePropertyAccessor()
{
    int nesting = 0;
    QByteArray accessor;
    while (1) {
        Token t = peek();
        if (!nesting && (t == RPAREN || t == COMMA))
            break;
        t = next();
        if (t == LPAREN)
            ++nesting;
        if (t == RPAREN)
            --nesting;
        accessor += lexem();
    }
    return accessor;
}